

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O0

exr_result_t
internal_decode_alloc_buffer
          (exr_decode_pipeline_t *decode,exr_transcoding_pipeline_buffer_id_t bufid,void **buf,
          size_t *cursz,size_t newsz)

{
  long lVar1;
  exr_result_t eVar2;
  void **in_RCX;
  long *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  size_t *in_R8;
  exr_const_context_t ctxt_1;
  exr_const_context_t ctxt;
  void *curbuf;
  long local_38;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_R8 == (size_t *)0x0) {
    return 0;
  }
  if ((*in_RDX == 0) || (*in_RCX < in_R8)) {
    internal_decode_free_buffer
              ((exr_decode_pipeline_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
               (exr_transcoding_pipeline_buffer_id_t)((ulong)in_RDX >> 0x20),in_RCX,in_R8);
    if (*(long *)(in_RDI + 0xd8) == 0) {
      lVar1 = *(long *)(in_RDI + 0x18);
      if (lVar1 == 0) {
        return 2;
      }
      if ((*(int *)(in_RDI + 0x14) < 0) || (*(int *)(lVar1 + 0xc4) <= *(int *)(in_RDI + 0x14))) {
        eVar2 = (**(code **)(lVar1 + 0x48))
                          (lVar1,4,"Part index (%d) out of range",*(undefined4 *)(in_RDI + 0x14));
        return eVar2;
      }
      local_38 = (**(code **)(lVar1 + 0x58))(in_R8);
    }
    else {
      local_38 = (**(code **)(in_RDI + 0xd8))(in_ESI,in_R8);
    }
    if (local_38 == 0) {
      lVar1 = *(long *)(in_RDI + 0x18);
      if (lVar1 == 0) {
        return 2;
      }
      if ((-1 < *(int *)(in_RDI + 0x14)) && (*(int *)(in_RDI + 0x14) < *(int *)(lVar1 + 0xc4))) {
        eVar2 = (**(code **)(lVar1 + 0x48))(lVar1,1,"Unable to allocate %lu bytes",in_R8);
        return eVar2;
      }
      eVar2 = (**(code **)(lVar1 + 0x48))
                        (lVar1,4,"Part index (%d) out of range",*(undefined4 *)(in_RDI + 0x14));
      return eVar2;
    }
    *in_RDX = local_38;
    *in_RCX = in_R8;
  }
  return 0;
}

Assistant:

exr_result_t
internal_decode_alloc_buffer (
    exr_decode_pipeline_t*               decode,
    exr_transcoding_pipeline_buffer_id_t bufid,
    void**                               buf,
    size_t*                              cursz,
    size_t                               newsz)
{
    void* curbuf = *buf;

    /* We might have a zero size here due to y sampling on a scanline
     * image where there is an attempt to read that portion of the
     * image. Just shortcut here and handle at a higher level where
     * there is more context
     */
    if (newsz == 0) return EXR_ERR_SUCCESS;

    if (!curbuf || *cursz < newsz)
    {
        internal_decode_free_buffer (decode, bufid, buf, cursz);

        if (decode->alloc_fn)
            curbuf = decode->alloc_fn (bufid, newsz);
        else
        {
            exr_const_context_t ctxt = decode->context;
            EXR_CHECK_CONTEXT_AND_PART (decode->part_index);

            curbuf = ctxt->alloc_fn (newsz);
        }

        if (curbuf == NULL)
        {
            exr_const_context_t ctxt = decode->context;
            EXR_CHECK_CONTEXT_AND_PART (decode->part_index);

            return ctxt->print_error (
                ctxt,
                EXR_ERR_OUT_OF_MEMORY,
                "Unable to allocate %" PRIu64 " bytes",
                (uint64_t) newsz);
        }

        *buf   = curbuf;
        *cursz = newsz;
    }
    return EXR_ERR_SUCCESS;
}